

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

int If_CluCheckDecInU(word t,int nVars)

{
  word wVar1;
  word wVar2;
  word wVar3;
  word wVar4;
  int iVar;
  int iVar5;
  word t_00;
  word t_01;
  
  t_00 = (long)((ulong)((uint)t & 0x55555555) * 0x300000000) >> 0x20;
  t_01 = (word)(int)((uint)((t & 0xaaaaaaaaaaaaaaaa) >> 1) | (uint)(t & 0xaaaaaaaaaaaaaaaa));
  iVar = 1;
  do {
    if (nVars <= iVar) {
      return 0;
    }
    wVar1 = Abc_Tt6Cofactor0(t_00,iVar);
    wVar2 = Abc_Tt6Cofactor1(t_00,iVar);
    wVar3 = Abc_Tt6Cofactor0(t_01,iVar);
    wVar4 = Abc_Tt6Cofactor1(t_01,iVar);
    iVar5 = (int)wVar1;
    iVar = iVar + 1;
  } while ((iVar5 != (int)wVar3) || (iVar5 != (int)wVar2 && iVar5 != (int)wVar4));
  return 1;
}

Assistant:

int If_CluCheckDecInU( word t, int nVars )
{
    int v, u, Cof2[2], Cof4[4];
//    for ( v = 0; v < nVars; v++ )
    for ( v = 0; v < 1; v++ ) // restrict to the first (decomposed) input
    {
        Cof2[0] = Abc_Tt6Cofactor0( t, v );
        Cof2[1] = Abc_Tt6Cofactor1( t, v );
        for ( u = v+1; u < nVars; u++ )
        {
            Cof4[0] = Abc_Tt6Cofactor0( Cof2[0], u ); // 00
            Cof4[1] = Abc_Tt6Cofactor1( Cof2[0], u ); // 01
            Cof4[2] = Abc_Tt6Cofactor0( Cof2[1], u ); // 10
            Cof4[3] = Abc_Tt6Cofactor1( Cof2[1], u ); // 11 
            if ( Cof4[0] == Cof4[1] && Cof4[0] == Cof4[2] ) //  F * a
                return 1;
            if ( Cof4[0] == Cof4[2] && Cof4[0] == Cof4[3] ) // !F * a
                return 1;
        }
    }
    return 0;
}